

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetDirectoriesFromFile(cmake *this,char *arg)

{
  cmState *this_00;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  bool collapse;
  bool collapse_00;
  undefined1 local_370 [8];
  string cwd_1;
  string local_348;
  undefined1 local_328 [8];
  string full;
  string cwd;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  char *local_298;
  char *existingValue;
  string local_270;
  undefined1 local_250 [8];
  string name_1;
  string local_228;
  undefined1 local_208 [8];
  string fullPath_1;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [8];
  string name;
  string local_160;
  undefined1 local_140 [8];
  string fullPath;
  string listFile;
  string cacheFile;
  string local_d8;
  undefined1 local_b8 [8];
  string path;
  allocator<char> local_81;
  string local_80;
  byte local_59;
  undefined1 local_58 [7];
  bool argIsFile;
  string cachePath;
  string listPath;
  char *arg_local;
  cmake *this_local;
  
  std::__cxx11::string::string((string *)(cachePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  local_59 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,arg,&local_81);
  bVar1 = cmsys::SystemTools::FileIsDirectory(&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,arg,(allocator<char> *)(cacheFile.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::CollapseFullPath((string *)local_b8,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)(cacheFile.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_b8);
    std::__cxx11::string::string((string *)(listFile.field_2._M_local_buf + 8),(string *)local_b8);
    std::__cxx11::string::operator+=
              ((string *)(listFile.field_2._M_local_buf + 8),"/CMakeCache.txt");
    std::__cxx11::string::string((string *)(fullPath.field_2._M_local_buf + 8),(string *)local_b8);
    std::__cxx11::string::operator+=
              ((string *)(fullPath.field_2._M_local_buf + 8),"/CMakeLists.txt");
    bVar1 = cmsys::SystemTools::FileExists((string *)((long)&listFile.field_2 + 8));
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_58,(string *)local_b8);
    }
    bVar1 = cmsys::SystemTools::FileExists((string *)((long)&fullPath.field_2 + 8));
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(cachePath.field_2._M_local_buf + 8),(string *)local_b8);
    }
    std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(listFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(arg);
    if (bVar1) {
      local_59 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,arg,(allocator<char> *)(name.field_2._M_local_buf + 0xf));
      cmsys::SystemTools::CollapseFullPath((string *)local_140,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
      cmsys::SystemTools::GetFilenameName((string *)local_188,(string *)local_140);
      cmsys::SystemTools::LowerCase(&local_1a8,(string *)local_188);
      std::__cxx11::string::operator=((string *)local_188,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_188,"cmakecache.txt");
      if (bVar1) {
        cmsys::SystemTools::GetFilenamePath(&local_1c8,(string *)local_140);
        std::__cxx11::string::operator=((string *)local_58,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_188,"cmakelists.txt");
        if (bVar1) {
          cmsys::SystemTools::GetFilenamePath
                    ((string *)((long)&fullPath_1.field_2 + 8),(string *)local_140);
          std::__cxx11::string::operator=
                    ((string *)(cachePath.field_2._M_local_buf + 8),
                     (string *)(fullPath_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(fullPath_1.field_2._M_local_buf + 8));
        }
      }
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)local_140);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,arg,(allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
      cmsys::SystemTools::CollapseFullPath((string *)local_208,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
      cmsys::SystemTools::GetFilenameName((string *)local_250,(string *)local_208);
      cmsys::SystemTools::LowerCase(&local_270,(string *)local_250);
      std::__cxx11::string::operator=((string *)local_250,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_250,"cmakecache.txt");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_250,"cmakelists.txt"), bVar1)) {
        local_59 = 1;
        cmsys::SystemTools::GetFilenamePath((string *)&existingValue,(string *)local_208);
        std::__cxx11::string::operator=
                  ((string *)(cachePath.field_2._M_local_buf + 8),(string *)&existingValue);
        std::__cxx11::string::~string((string *)&existingValue);
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(cachePath.field_2._M_local_buf + 8),(string *)local_208);
      }
      std::__cxx11::string::~string((string *)local_250);
      std::__cxx11::string::~string((string *)local_208);
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = LoadCache(this,(string *)local_58), bVar1)) {
    this_00 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"CMAKE_HOME_DIRECTORY",&local_2b9);
    pcVar3 = cmState::GetCacheEntryValue(this_00,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    local_298 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      SetHomeOutputDirectory(this,(string *)local_58);
      pcVar3 = local_298;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,pcVar3,(allocator<char> *)(cwd.field_2._M_local_buf + 0xf));
      SetHomeDirectory(this,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)(cwd.field_2._M_local_buf + 0xf));
      cwd.field_2._8_4_ = 1;
      goto LAB_002fcd91;
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    SetHomeDirectory(this,(string *)((long)&cachePath.field_2 + 8));
    if ((local_59 & 1) == 0) {
      GetHomeOutputDirectory_abi_cxx11_(this);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  ((string *)((long)&full.field_2 + 8),(SystemTools *)0x1,collapse);
        SetHomeOutputDirectory(this,(string *)((long)&full.field_2 + 8));
        std::__cxx11::string::~string((string *)(full.field_2._M_local_buf + 8));
      }
    }
    else {
      SetHomeOutputDirectory(this,(string *)((long)&cachePath.field_2 + 8));
    }
    cwd.field_2._8_4_ = 1;
  }
  else {
    GetHomeDirectory_abi_cxx11_(this);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,arg,(allocator<char> *)(cwd_1.field_2._M_local_buf + 0xf));
      cmsys::SystemTools::CollapseFullPath((string *)local_328,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator((allocator<char> *)(cwd_1.field_2._M_local_buf + 0xf));
      SetHomeDirectory(this,(string *)local_328);
      std::__cxx11::string::~string((string *)local_328);
    }
    GetHomeOutputDirectory_abi_cxx11_(this);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                ((string *)local_370,(SystemTools *)0x1,collapse_00);
      SetHomeOutputDirectory(this,(string *)local_370);
      std::__cxx11::string::~string((string *)local_370);
    }
    cwd.field_2._8_4_ = 0;
  }
LAB_002fcd91:
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(cachePath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmake::SetDirectoriesFromFile(const char* arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool argIsFile = false;
  if (cmSystemTools::FileIsDirectory(arg)) {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = path;
    cacheFile += "/CMakeCache.txt";
    std::string listFile = path;
    listFile += "/CMakeLists.txt";
    if (cmSystemTools::FileExists(cacheFile)) {
      cachePath = path;
    }
    if (cmSystemTools::FileExists(listFile)) {
      listPath = path;
    }
  } else if (cmSystemTools::FileExists(arg)) {
    argIsFile = true;
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt") {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
    } else if (name == "cmakelists.txt") {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    }
  } else {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt" || name == "cmakelists.txt") {
      argIsFile = true;
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    } else {
      listPath = fullPath;
    }
  }

  // If there is a CMakeCache.txt file, use its settings.
  if (!cachePath.empty()) {
    if (this->LoadCache(cachePath)) {
      const char* existingValue =
        this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue) {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(existingValue);
        return;
      }
    }
  }

  // If there is a CMakeLists.txt file, use it as the source tree.
  if (!listPath.empty()) {
    this->SetHomeDirectory(listPath);

    if (argIsFile) {
      // Source CMakeLists.txt file given.  It was probably dropped
      // onto the executable in a GUI.  Default to an in-source build.
      this->SetHomeOutputDirectory(listPath);
    } else {
      // Source directory given on command line.  Use current working
      // directory as build tree if -B hasn't been given already
      if (this->GetHomeOutputDirectory().empty()) {
        std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
        this->SetHomeOutputDirectory(cwd);
      }
    }
    return;
  }

  if (this->GetHomeDirectory().empty()) {
    // We didn't find a CMakeLists.txt and it wasn't specified
    // with -S. Assume it is the path to the source tree
    std::string full = cmSystemTools::CollapseFullPath(arg);
    this->SetHomeDirectory(full);
  }
  if (this->GetHomeOutputDirectory().empty()) {
    // We didn't find a CMakeCache.txt and it wasn't specified
    // with -B. Assume the current working directory as the build tree.
    std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
    this->SetHomeOutputDirectory(cwd);
  }
}